

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O3

int lj_obj_equal(cTValue *o1,cTValue *o2)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  
  dVar1 = o1->n;
  uVar3 = (long)dVar1 >> 0x2f;
  dVar2 = o2->n;
  if (uVar3 == (long)dVar2 >> 0x2f) {
    bVar4 = true;
    if (0xfffffffffffffffc < uVar3) goto LAB_001190e6;
    if (0xfffffffffffffff1 < uVar3) {
      bVar4 = dVar1 == dVar2;
      goto LAB_001190e6;
    }
  }
  else if (0xfffffffffffffff2 < (ulong)((long)dVar2 >> 0x2f) || 0xfffffffffffffff2 < uVar3) {
    bVar4 = false;
    goto LAB_001190e6;
  }
  bVar4 = (bool)(-(dVar2 == dVar1) & 1);
LAB_001190e6:
  return (int)bVar4;
}

Assistant:

int LJ_FASTCALL lj_obj_equal(cTValue *o1, cTValue *o2)
{
  if (itype(o1) == itype(o2)) {
    if (tvispri(o1))
      return 1;
    if (!tvisnum(o1))
      return gcrefeq(o1->gcr, o2->gcr);
  } else if (!tvisnumber(o1) || !tvisnumber(o2)) {
    return 0;
  }
  return numberVnum(o1) == numberVnum(o2);
}